

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void __thiscall ByteCodeGenerator::StartBindCatch(ByteCodeGenerator *this,ParseNode *pnode)

{
  Scope *innerScope;
  code *pcVar1;
  bool bVar2;
  ParseNodeCatch *pPVar3;
  undefined4 *puVar4;
  Scope *pSVar5;
  
  pPVar3 = ParseNode::AsParseNodeCatch(pnode);
  innerScope = pPVar3->scope;
  if (innerScope == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x63e,"(scope)","scope");
    if (!bVar2) goto LAB_0077b9ce;
    *puVar4 = 0;
  }
  pSVar5 = this->currentScope;
  if (pSVar5 == (Scope *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x63f,"(currentScope)","currentScope");
    if (!bVar2) {
LAB_0077b9ce:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    pSVar5 = this->currentScope;
  }
  innerScope->func = pSVar5->func;
  PushScope(this,innerScope);
  return;
}

Assistant:

void ByteCodeGenerator::StartBindCatch(ParseNode *pnode)
{
    Scope *scope = pnode->AsParseNodeCatch()->scope;
    Assert(scope);
    Assert(currentScope);
    scope->SetFunc(currentScope->GetFunc());
    PushScope(scope);
}